

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

Token * __thiscall czh::lexer::Lexer::get(Token *__return_storage_ptr__,Lexer *this)

{
  Token *t_00;
  Token t;
  Token local_c8;
  Token local_78;
  
  t_00 = &this->buffer;
  token::Token::Token(&local_c8,t_00);
  if (local_c8.type == UNEXPECTED) {
    get_tok(&local_78,this);
    token::Token::operator=(&local_c8,&local_78);
    token::Token::~Token(&local_78);
    check_token(this,&local_c8);
    this->is_eof = local_c8.type == FEND;
  }
  get_tok(&local_78,this);
  token::Token::operator=(t_00,&local_78);
  token::Token::~Token(&local_78);
  check_token(this,t_00);
  this->is_eof = (this->buffer).type == FEND;
  token::Token::Token(__return_storage_ptr__,&local_c8);
  token::Token::~Token(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

token::Token get()
    {
      token::Token t = std::move(buffer);
      if (t.type == token::TokenType::UNEXPECTED)
      {
        t = std::move(get_tok());
        check_token(t);
        is_eof = (t.type == token::TokenType::FEND);
      }
      buffer = std::move(get_tok());
      check_token(buffer);
      is_eof = (buffer.type == token::TokenType::FEND);
      return std::move(t);
    }